

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O2

void __thiscall
StdExceptionCatcher_Tests::Test_that_std_exception_catcher_works::test_method
          (Test_that_std_exception_catcher_works *this)

{
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  catcher;
  
  throw_std_exception();
  throw_std_exception();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Test_that_std_exception_catcher_works)
{
   {
      auto catcher = std_exception_handler(EXIT_FAILURE, UnHandler<int>());
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
      }
   }
   {
      auto catcher = std_exception_handler(EXIT_FAILURE); // default nest handler
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
      }
   }

}